

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

bool __thiscall
AsyncRgbLedAnalyzer::DetectSpeedMode
          (AsyncRgbLedAnalyzer *this,double positiveTimeSec,double negativeTimeSec,BitState *value)

{
  bool bVar1;
  pointer pAVar2;
  ostream *poVar3;
  BitTiming local_100;
  BitState local_cc;
  const_iterator pBStack_c8;
  BitState b_1;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<BitState> local_b0;
  initializer_list<BitState> *local_a0;
  initializer_list<BitState> *__range2;
  BitState local_64;
  const_iterator pBStack_60;
  BitState b;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<BitState> local_48;
  initializer_list<BitState> *local_38;
  initializer_list<BitState> *__range1;
  BitState *value_local;
  double negativeTimeSec_local;
  double positiveTimeSec_local;
  AsyncRgbLedAnalyzer *this_local;
  
  this->mDidDetectHighSpeed = false;
  __begin1._0_4_ = 0;
  __begin1._4_4_ = 1;
  local_48._M_array = (iterator)&__begin1;
  local_48._M_len = 2;
  local_38 = &local_48;
  __range1 = (initializer_list<BitState> *)value;
  value_local = (BitState *)negativeTimeSec;
  negativeTimeSec_local = positiveTimeSec;
  positiveTimeSec_local = (double)this;
  __end1 = std::initializer_list<BitState>::begin(local_38);
  pBStack_60 = std::initializer_list<BitState>::end(local_38);
  for (; __end1 != pBStack_60; __end1 = __end1 + 1) {
    local_64 = *__end1;
    pAVar2 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::DataTiming((BitTiming *)&__range2,pAVar2,local_64,false);
    bVar1 = BitTiming::WithinTolerance
                      ((BitTiming *)&__range2,negativeTimeSec_local,(double)value_local);
    if (bVar1) {
      *(BitState *)&__range1->_M_array = local_64;
      this->mFirstBitAfterReset = false;
      return true;
    }
  }
  pAVar2 = std::
           unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
           ::operator->(&this->mSettings);
  bVar1 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported(pAVar2);
  if (bVar1) {
    __begin2._0_4_ = 0;
    __begin2._4_4_ = 1;
    local_b0._M_array = (iterator)&__begin2;
    local_b0._M_len = 2;
    local_a0 = &local_b0;
    __end2 = std::initializer_list<BitState>::begin(local_a0);
    pBStack_c8 = std::initializer_list<BitState>::end(local_a0);
    for (; __end2 != pBStack_c8; __end2 = __end2 + 1) {
      local_cc = *__end2;
      pAVar2 = std::
               unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      AsyncRgbLedAnalyzerSettings::DataTiming(&local_100,pAVar2,local_cc,true);
      bVar1 = BitTiming::WithinTolerance(&local_100,negativeTimeSec_local,(double)value_local);
      if (bVar1) {
        this->mDidDetectHighSpeed = true;
        *(BitState *)&__range1->_M_array = local_cc;
        this->mFirstBitAfterReset = false;
        return true;
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"failed to classify: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,negativeTimeSec_local);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)value_local);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool AsyncRgbLedAnalyzer::DetectSpeedMode( double positiveTimeSec, double negativeTimeSec, BitState& value )
{
    mDidDetectHighSpeed = false;

    // low speed bits
    for( const auto b : { BIT_LOW, BIT_HIGH } )
    {
        if( mSettings->DataTiming( b ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
        {
            value = b;
            mFirstBitAfterReset = false;
            return true;
        }
    }

    if( mSettings->IsHighSpeedSupported() )
    {
        // high speed bits
        for( const auto b : { BIT_LOW, BIT_HIGH } )
        {
            if( mSettings->DataTiming( b, true ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
            {
                mDidDetectHighSpeed = true;
                value = b;
                mFirstBitAfterReset = false;
                return true;
            }
        }
    } // of high-speed mode tests

    std::cerr << "failed to classify: " << positiveTimeSec << "/" << negativeTimeSec << std::endl;
    return false;
}